

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::ArrayJoinPromiseNodeBase::Branch::fire(Branch *this)

{
  bool bVar1;
  int iVar2;
  PromiseNode *pPVar3;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  Branch *this_local;
  
  iVar2 = *(int *)(*(long *)(in_RSI + 0x40) + 0x14) + -1;
  *(int *)(*(long *)(in_RSI + 0x40) + 0x14) = iVar2;
  if ((iVar2 == 0) && ((*(byte *)(*(long *)(in_RSI + 0x40) + 0x20) & 1) == 0)) {
    PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x40) + 0x18));
    *(undefined1 *)(*(long *)(in_RSI + 0x40) + 0x20) = 1;
  }
  if (*(int *)(*(long *)(in_RSI + 0x40) + 0x10) == 1) {
    pPVar3 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->
                       ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x48));
    (*(pPVar3->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])
              (pPVar3,*(undefined8 *)(in_RSI + 0x50));
    bVar1 = Maybe<kj::Exception>::operator==(*(Maybe<kj::Exception> **)(in_RSI + 0x50));
    if ((((bVar1 ^ 0xffU) & 1) != 0) && ((*(byte *)(*(long *)(in_RSI + 0x40) + 0x20) & 1) == 0)) {
      PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x40) + 0x18));
      *(undefined1 *)(*(long *)(in_RSI + 0x40) + 0x20) = 1;
    }
  }
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
  MVar4.ptr.ptr = extraout_RDX;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> ArrayJoinPromiseNodeBase::Branch::fire() {
  if (--joinNode.countLeft == 0 && !joinNode.armed) {
    joinNode.onReadyEvent.arm();
    joinNode.armed = true;
  }

  if (joinNode.joinBehavior == ArrayJoinBehavior::EAGER) {
    // This implements `joinPromisesFailFast()`'s eager-evaluation semantics.
    dependency->get(output);
    if (output.exception != kj::none && !joinNode.armed) {
      joinNode.onReadyEvent.arm();
      joinNode.armed = true;
    }
  }

  return kj::none;
}